

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018ee30 = 0x2d2d2d2d2d2d2d;
    uRam000000000018ee37._0_1_ = '-';
    uRam000000000018ee37._1_1_ = '-';
    uRam000000000018ee37._2_1_ = '-';
    uRam000000000018ee37._3_1_ = '-';
    uRam000000000018ee37._4_1_ = '-';
    uRam000000000018ee37._5_1_ = '-';
    uRam000000000018ee37._6_1_ = '-';
    uRam000000000018ee37._7_1_ = '-';
    DAT_0018ee20 = '-';
    DAT_0018ee20_1._0_1_ = '-';
    DAT_0018ee20_1._1_1_ = '-';
    DAT_0018ee20_1._2_1_ = '-';
    DAT_0018ee20_1._3_1_ = '-';
    DAT_0018ee20_1._4_1_ = '-';
    DAT_0018ee20_1._5_1_ = '-';
    DAT_0018ee20_1._6_1_ = '-';
    uRam000000000018ee28 = 0x2d2d2d2d2d2d2d;
    DAT_0018ee2f = 0x2d;
    DAT_0018ee10 = '-';
    DAT_0018ee10_1._0_1_ = '-';
    DAT_0018ee10_1._1_1_ = '-';
    DAT_0018ee10_1._2_1_ = '-';
    DAT_0018ee10_1._3_1_ = '-';
    DAT_0018ee10_1._4_1_ = '-';
    DAT_0018ee10_1._5_1_ = '-';
    DAT_0018ee10_1._6_1_ = '-';
    uRam000000000018ee18._0_1_ = '-';
    uRam000000000018ee18._1_1_ = '-';
    uRam000000000018ee18._2_1_ = '-';
    uRam000000000018ee18._3_1_ = '-';
    uRam000000000018ee18._4_1_ = '-';
    uRam000000000018ee18._5_1_ = '-';
    uRam000000000018ee18._6_1_ = '-';
    uRam000000000018ee18._7_1_ = '-';
    DAT_0018ee00 = '-';
    DAT_0018ee00_1._0_1_ = '-';
    DAT_0018ee00_1._1_1_ = '-';
    DAT_0018ee00_1._2_1_ = '-';
    DAT_0018ee00_1._3_1_ = '-';
    DAT_0018ee00_1._4_1_ = '-';
    DAT_0018ee00_1._5_1_ = '-';
    DAT_0018ee00_1._6_1_ = '-';
    uRam000000000018ee08._0_1_ = '-';
    uRam000000000018ee08._1_1_ = '-';
    uRam000000000018ee08._2_1_ = '-';
    uRam000000000018ee08._3_1_ = '-';
    uRam000000000018ee08._4_1_ = '-';
    uRam000000000018ee08._5_1_ = '-';
    uRam000000000018ee08._6_1_ = '-';
    uRam000000000018ee08._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000018edf8._0_1_ = '-';
    uRam000000000018edf8._1_1_ = '-';
    uRam000000000018edf8._2_1_ = '-';
    uRam000000000018edf8._3_1_ = '-';
    uRam000000000018edf8._4_1_ = '-';
    uRam000000000018edf8._5_1_ = '-';
    uRam000000000018edf8._6_1_ = '-';
    uRam000000000018edf8._7_1_ = '-';
    DAT_0018ee3f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}